

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_function.cpp
# Opt level: O2

void __thiscall
duckdb::Transformer::TransformWindowFrame
          (Transformer *this,PGWindowDef *window_spec,WindowExpression *expr)

{
  ExpressionType EVar1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  undefined8 uVar3;
  uint uVar4;
  ParserException *this_00;
  InternalException *pIVar5;
  ExpressionType type;
  WindowBoundary WVar6;
  allocator local_69;
  undefined1 local_68 [32];
  string local_48;
  
  TransformExpression((Transformer *)local_68,(optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
  uVar3 = local_68._0_8_;
  local_68._0_8_ = (Transformer *)0x0;
  _Var2._M_head_impl =
       (expr->start_expr).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (expr->start_expr).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)uVar3
  ;
  if ((_Var2._M_head_impl != (ParsedExpression *)0x0) &&
     ((**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))(),
     (Transformer *)local_68._0_8_ != (Transformer *)0x0)) {
    (**(code **)(*(long *)local_68._0_8_ + 8))();
  }
  TransformExpression((Transformer *)local_68,(optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
  uVar3 = local_68._0_8_;
  local_68._0_8_ = (Transformer *)0x0;
  _Var2._M_head_impl =
       (expr->end_expr).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (expr->end_expr).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)uVar3
  ;
  if ((_Var2._M_head_impl != (ParsedExpression *)0x0) &&
     ((**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))(),
     (Transformer *)local_68._0_8_ != (Transformer *)0x0)) {
    (**(code **)(*(long *)local_68._0_8_ + 8))();
  }
  uVar4 = window_spec->frameOptions;
  if ((uVar4 & 0xc0) != 0) {
    pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)local_68,
               "Window frames starting with unbounded following or ending in unbounded preceding make no sense"
               ,(allocator *)(local_68 + 0x20));
    InternalException::InternalException(pIVar5,(string *)local_68);
    __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  WVar6 = UNBOUNDED_PRECEDING;
  if ((uVar4 & 0x20) == 0) {
    if ((uVar4 >> 0xb & 1) != 0) {
      WVar6 = ((uVar4 & 8) != 0) * '\x05' + EXPR_PRECEDING_ROWS;
      if ((uVar4 & 2) != 0) {
        WVar6 = EXPR_PRECEDING_RANGE;
      }
      goto LAB_01a963ab;
    }
    if ((uVar4 >> 0xd & 1) != 0) {
      WVar6 = ((uVar4 & 8) != 0) * '\x05' + EXPR_FOLLOWING_ROWS;
      if ((uVar4 & 2) != 0) {
        WVar6 = EXPR_FOLLOWING_RANGE;
      }
      goto LAB_01a963ab;
    }
    if ((uVar4 >> 9 & 1) != 0) {
      WVar6 = ((uVar4 & 8) != 0) * '\x05' + CURRENT_ROW_ROWS;
      if ((uVar4 & 2) != 0) {
        WVar6 = CURRENT_ROW_RANGE;
      }
      goto LAB_01a963ab;
    }
  }
  else {
LAB_01a963ab:
    expr->start = WVar6;
  }
  WVar6 = UNBOUNDED_FOLLOWING;
  if ((uVar4 >> 8 & 1) == 0) {
    if ((uVar4 >> 0xc & 1) == 0) {
      if ((uVar4 >> 0xe & 1) == 0) {
        if ((uVar4 >> 10 & 1) == 0) goto LAB_01a9640e;
        WVar6 = CURRENT_ROW_RANGE;
        if ((uVar4 & 2) == 0) {
          WVar6 = ((uVar4 & 8) != 0) * '\x05' + CURRENT_ROW_ROWS;
        }
      }
      else {
        WVar6 = EXPR_FOLLOWING_RANGE;
        if ((uVar4 & 2) == 0) {
          WVar6 = ((uVar4 & 8) != 0) * '\x05' + EXPR_FOLLOWING_ROWS;
        }
      }
    }
    else {
      WVar6 = EXPR_PRECEDING_RANGE;
      if ((uVar4 & 2) == 0) {
        WVar6 = ((uVar4 & 8) != 0) * '\x05' + EXPR_PRECEDING_ROWS;
      }
    }
  }
  expr->end = WVar6;
LAB_01a9640e:
  if ((((uVar4 & 0x2800) != 0) &&
      ((expr->start_expr).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
       (ParsedExpression *)0x0)) ||
     (((uVar4 & 0x5000) != 0 &&
      ((expr->end_expr).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
       (ParsedExpression *)0x0)))) {
    pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)local_68,"Failed to transform window boundary expression",
               (allocator *)(local_68 + 0x20));
    InternalException::InternalException(pIVar5,(string *)local_68);
    __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((short)uVar4 < 0) {
    expr->exclude_clause = CURRENT_ROW;
  }
  else if ((uVar4 >> 0x10 & 1) == 0) {
    if ((uVar4 >> 0x11 & 1) == 0) {
      expr->exclude_clause = NO_OTHER;
      return;
    }
    expr->exclude_clause = TIES;
  }
  else {
    expr->exclude_clause = GROUP;
  }
  if ((expr->arg_orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (expr->arg_orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    EVar1 = (expr->super_ParsedExpression).super_BaseExpression.type;
    uVar4 = EVar1 - 0x6e;
    if (uVar4 < 0x19) {
      if ((0x1300001U >> (uVar4 & 0x1f) & 1) != 0) {
        return;
      }
      if ((0xc0fc00U >> (uVar4 & 0x1f) & 1) != 0) {
        this_00 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_68,"EXCLUDE is not supported for the window function \"%s\"",
                   (allocator *)(local_68 + 0x20));
        ParserException::ParserException<char_const*>
                  (this_00,(string *)local_68,(expr->function_name)._M_dataplus._M_p);
        __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)local_68,"Unknown excludable window type %s",&local_69)
    ;
    ExpressionTypeToString_abi_cxx11_((string *)(local_68 + 0x20),(duckdb *)(ulong)EVar1,type);
    InternalException::InternalException<char_const*>
              (pIVar5,(string *)local_68,local_48._M_dataplus._M_p);
    __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void Transformer::TransformWindowFrame(duckdb_libpgquery::PGWindowDef &window_spec, WindowExpression &expr) {
	// finally: specifics of bounds
	expr.start_expr = TransformExpression(window_spec.startOffset);
	expr.end_expr = TransformExpression(window_spec.endOffset);

	if ((window_spec.frameOptions & FRAMEOPTION_END_UNBOUNDED_PRECEDING) ||
	    (window_spec.frameOptions & FRAMEOPTION_START_UNBOUNDED_FOLLOWING)) {
		throw InternalException(
		    "Window frames starting with unbounded following or ending in unbounded preceding make no sense");
	}

	if (window_spec.frameOptions & FRAMEOPTION_START_UNBOUNDED_PRECEDING) {
		expr.start = WindowBoundary::UNBOUNDED_PRECEDING;
	} else if (window_spec.frameOptions & FRAMEOPTION_START_OFFSET_PRECEDING) {
		expr.start = TransformFrameOption(window_spec.frameOptions, WindowBoundary::EXPR_PRECEDING_ROWS,
		                                  WindowBoundary::EXPR_PRECEDING_RANGE, WindowBoundary::EXPR_PRECEDING_GROUPS);
	} else if (window_spec.frameOptions & FRAMEOPTION_START_OFFSET_FOLLOWING) {
		expr.start = TransformFrameOption(window_spec.frameOptions, WindowBoundary::EXPR_FOLLOWING_ROWS,
		                                  WindowBoundary::EXPR_FOLLOWING_RANGE, WindowBoundary::EXPR_FOLLOWING_GROUPS);
	} else if (window_spec.frameOptions & FRAMEOPTION_START_CURRENT_ROW) {
		expr.start = TransformFrameOption(window_spec.frameOptions, WindowBoundary::CURRENT_ROW_ROWS,
		                                  WindowBoundary::CURRENT_ROW_RANGE, WindowBoundary::CURRENT_ROW_GROUPS);
	}

	if (window_spec.frameOptions & FRAMEOPTION_END_UNBOUNDED_FOLLOWING) {
		expr.end = WindowBoundary::UNBOUNDED_FOLLOWING;
	} else if (window_spec.frameOptions & FRAMEOPTION_END_OFFSET_PRECEDING) {
		expr.end = TransformFrameOption(window_spec.frameOptions, WindowBoundary::EXPR_PRECEDING_ROWS,
		                                WindowBoundary::EXPR_PRECEDING_RANGE, WindowBoundary::EXPR_PRECEDING_GROUPS);
	} else if (window_spec.frameOptions & FRAMEOPTION_END_OFFSET_FOLLOWING) {
		expr.end = TransformFrameOption(window_spec.frameOptions, WindowBoundary::EXPR_FOLLOWING_ROWS,
		                                WindowBoundary::EXPR_FOLLOWING_RANGE, WindowBoundary::EXPR_FOLLOWING_GROUPS);
	} else if (window_spec.frameOptions & FRAMEOPTION_END_CURRENT_ROW) {
		expr.end = TransformFrameOption(window_spec.frameOptions, WindowBoundary::CURRENT_ROW_ROWS,
		                                WindowBoundary::CURRENT_ROW_RANGE, WindowBoundary::CURRENT_ROW_GROUPS);
	}

	D_ASSERT(expr.start != WindowBoundary::INVALID && expr.end != WindowBoundary::INVALID);
	if (((window_spec.frameOptions & (FRAMEOPTION_START_OFFSET_PRECEDING | FRAMEOPTION_START_OFFSET_FOLLOWING)) &&
	     !expr.start_expr) ||
	    ((window_spec.frameOptions & (FRAMEOPTION_END_OFFSET_PRECEDING | FRAMEOPTION_END_OFFSET_FOLLOWING)) &&
	     !expr.end_expr)) {
		throw InternalException("Failed to transform window boundary expression");
	}

	if (window_spec.frameOptions & FRAMEOPTION_EXCLUDE_CURRENT_ROW) {
		expr.exclude_clause = WindowExcludeMode::CURRENT_ROW;
	} else if (window_spec.frameOptions & FRAMEOPTION_EXCLUDE_GROUP) {
		expr.exclude_clause = WindowExcludeMode::GROUP;
	} else if (window_spec.frameOptions & FRAMEOPTION_EXCLUDE_TIES) {
		expr.exclude_clause = WindowExcludeMode::TIES;
	} else {
		expr.exclude_clause = WindowExcludeMode::NO_OTHER;
	}

	if (expr.exclude_clause != WindowExcludeMode::NO_OTHER && !expr.arg_orders.empty() &&
	    !IsExcludableWindowFunction(expr.type)) {
		throw ParserException("EXCLUDE is not supported for the window function \"%s\"", expr.function_name.c_str());
	}
}